

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uoptions.cpp
# Opt level: O0

int u_parseArgs(int argc,char **argv,int optionCount,UOption *options)

{
  bool bVar1;
  int iVar2;
  int local_50;
  int local_4c;
  int j_1;
  int j;
  UOption *option;
  int local_38;
  char stopOptions;
  int iStack_34;
  char c;
  int remaining;
  int i;
  char *arg;
  UOption *options_local;
  int optionCount_local;
  char **argv_local;
  int argc_local;
  
  iStack_34 = 1;
  local_38 = 1;
  bVar1 = false;
  do {
    if (argc <= iStack_34) {
      return local_38;
    }
    _remaining = argv[iStack_34];
    if (((bVar1) || (*_remaining != '-')) || (option._7_1_ = _remaining[1], option._7_1_ == '\0')) {
      argv[local_38] = _remaining;
      local_38 = local_38 + 1;
    }
    else {
      _j_1 = (UOption *)0x0;
      _remaining = _remaining + 2;
      if (option._7_1_ == '-') {
        if (*_remaining == '\0') {
          bVar1 = true;
        }
        else {
          for (local_4c = 0; local_4c < optionCount; local_4c = local_4c + 1) {
            if ((options[local_4c].longName != (char *)0x0) &&
               (iVar2 = strcmp(_remaining,options[local_4c].longName), iVar2 == 0)) {
              _j_1 = options + local_4c;
              break;
            }
          }
          if (_j_1 == (UOption *)0x0) {
            return -iStack_34;
          }
          _j_1->doesOccur = '\x01';
          if (_j_1->hasArg != '\0') {
            if ((iStack_34 + 1 < argc) &&
               ((*argv[iStack_34 + 1] != '-' || (argv[iStack_34 + 1][1] == '\0')))) {
              iStack_34 = iStack_34 + 1;
              _j_1->value = argv[iStack_34];
            }
            else if (_j_1->hasArg == '\x01') {
              _j_1->doesOccur = '\0';
              return -iStack_34;
            }
          }
          if ((_j_1->optionFn != (UOptionFn *)0x0) &&
             (iVar2 = (*_j_1->optionFn)(_j_1->context,_j_1), iVar2 < 0)) {
            _j_1->doesOccur = '\0';
            return -iStack_34;
          }
        }
      }
      else {
        do {
          _j_1 = (UOption *)0x0;
          for (local_50 = 0; local_50 < optionCount; local_50 = local_50 + 1) {
            if (option._7_1_ == options[local_50].shortName) {
              _j_1 = options + local_50;
              break;
            }
          }
          if (_j_1 == (UOption *)0x0) {
            return -iStack_34;
          }
          _j_1->doesOccur = '\x01';
          if (_j_1->hasArg != '\0') {
            if (*_remaining != '\0') {
              _j_1->value = _remaining;
              break;
            }
            if ((iStack_34 + 1 < argc) &&
               ((*argv[iStack_34 + 1] != '-' || (argv[iStack_34 + 1][1] == '\0')))) {
              iStack_34 = iStack_34 + 1;
              _j_1->value = argv[iStack_34];
              break;
            }
            if (_j_1->hasArg == '\x01') {
              _j_1->doesOccur = '\0';
              return -iStack_34;
            }
          }
          if ((_j_1->optionFn != (UOptionFn *)0x0) &&
             (iVar2 = (*_j_1->optionFn)(_j_1->context,_j_1), iVar2 < 0)) {
            _j_1->doesOccur = '\0';
            return -iStack_34;
          }
          option._7_1_ = *_remaining;
          _remaining = _remaining + 1;
        } while (option._7_1_ != '\0');
      }
    }
    iStack_34 = iStack_34 + 1;
  } while( true );
}

Assistant:

U_CAPI int U_EXPORT2
u_parseArgs(int argc, char* argv[],
            int optionCount, UOption options[]) {
    char *arg;
    int i=1, remaining=1;
    char c, stopOptions=0;

    while(i<argc) {
        arg=argv[i];
        if(!stopOptions && *arg=='-' && (c=arg[1])!=0) {
            /* process an option */
            UOption *option=NULL;
            arg+=2;
            if(c=='-') {
                /* process a long option */
                if(*arg==0) {
                    /* stop processing options after "--" */
                    stopOptions=1;
                } else {
                    /* search for the option string */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(options[j].longName && uprv_strcmp(arg, options[j].longName)==0) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }
                }
            } else {
                /* process one or more short options */
                do {
                    /* search for the option letter */
                    int j;
                    for(j=0; j<optionCount; ++j) {
                        if(c==options[j].shortName) {
                            option=options+j;
                            break;
                        }
                    }
                    if(option==NULL) {
                        /* no option matches */
                        return -i;
                    }
                    option->doesOccur=1;

                    if(option->hasArg!=UOPT_NO_ARG) {
                        /* parse the argument for the option, if any */
                        if(*arg!=0) {
                            /* argument following in the same argv[] */
                            option->value=arg;
                            /* do not process the rest of this arg as option letters */
                            break;
                        } else if(i+1<argc && !(argv[i+1][0]=='-' && argv[i+1][1]!=0)) {
                            /* argument in the next argv[], and there is not an option in there */
                            option->value=argv[++i];
                            /* this break is redundant because we know that *arg==0 */
                            break;
                        } else if(option->hasArg==UOPT_REQUIRES_ARG) {
                            /* there is no argument, but one is required: return with error */
                            option->doesOccur=0;
                            return -i;
                        }
                    }

                    if(option->optionFn!=NULL && option->optionFn(option->context, option)<0) {
                        /* the option function was called and returned an error */
                        option->doesOccur=0;
                        return -i;
                    }

                    /* get the next option letter */
                    option=NULL;
                    c=*arg++;
                } while(c!=0);
            }

            /* go to next argv[] */
            ++i;
        } else {
            /* move a non-option up in argv[] */
            argv[remaining++]=arg;
            ++i;
        }
    }
    return remaining;
}